

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

ImVector<ImDrawVert> * __thiscall
ImVector<ImDrawVert>::operator=(ImVector<ImDrawVert> *this,ImVector<ImDrawVert> *src)

{
  clear(this);
  resize(this,src->Size);
  if (src->Data != (ImDrawVert *)0x0) {
    memcpy(this->Data,src->Data,(long)this->Size * 0x14);
  }
  return this;
}

Assistant:

inline ImVector<T>& operator=(const ImVector<T>& src)   { clear(); resize(src.Size); if (src.Data) memcpy(Data, src.Data, (size_t)Size * sizeof(T)); return *this; }